

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void tcg_op_remove_arm(TCGContext_conflict *s,TCGOp *op)

{
  char cVar1;
  long lVar2;
  QTailQLink *pQVar3;
  anon_union_16_2_aaf24f3d_for_link *paVar4;
  long lStack_8;
  
  cVar1 = *(char *)op;
  if (cVar1 == '\x03') {
    lStack_8 = 0x18;
  }
  else {
    if (cVar1 != 'g') {
      if (cVar1 == '-') {
        lStack_8 = 0x40;
        goto LAB_0051371b;
      }
      if (cVar1 != '&') goto LAB_00513734;
    }
    lStack_8 = 0x30;
  }
LAB_0051371b:
  lVar2 = *(long *)((long)op->args + lStack_8 + -0x18);
  *(short *)(lVar2 + 2) = (short)((uint)*(ushort *)(lVar2 + 2) * 0x10000 + -0x10000 >> 0x10);
LAB_00513734:
  pQVar3 = (op->link).tqe_circ.tql_prev;
  paVar4 = &((op->link).tqe_next)->link;
  if ((op->link).tqe_next == (TCGOp *)0x0) {
    paVar4 = (anon_union_16_2_aaf24f3d_for_link *)&s->ops;
  }
  (paVar4->tqe_circ).tql_prev = pQVar3;
  pQVar3->tql_next = (op->link).tqe_next;
  (op->link).tqe_next = (TCGOp *)0x0;
  (op->link).tqe_circ.tql_prev = (QTailQLink *)0x0;
  pQVar3 = (s->free_ops).tqh_circ.tql_prev;
  (op->link).tqe_circ.tql_prev = pQVar3;
  pQVar3->tql_next = op;
  (s->free_ops).tqh_circ.tql_prev = (QTailQLink *)&op->link;
  s->nb_ops = s->nb_ops + -1;
  return;
}

Assistant:

void tcg_op_remove(TCGContext *s, TCGOp *op)
{
    TCGLabel *label;

    switch (op->opc) {
    case INDEX_op_br:
        label = arg_label(op->args[0]);
        label->refs--;
        break;
    case INDEX_op_brcond_i32:
    case INDEX_op_brcond_i64:
        label = arg_label(op->args[3]);
        label->refs--;
        break;
    case INDEX_op_brcond2_i32:
        label = arg_label(op->args[5]);
        label->refs--;
        break;
    default:
        break;
    }

    QTAILQ_REMOVE(&s->ops, op, link);
    QTAILQ_INSERT_TAIL(&s->free_ops, op, link);
    s->nb_ops--;
}